

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool Internal_IsUnsetFloat(size_t count,float *a)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  
  pfVar2 = a;
  do {
    pfVar3 = pfVar2;
    if (a + count <= pfVar3) break;
    fVar1 = *pfVar3;
    if ((fVar1 == -1.234321e+38) && (!NAN(fVar1))) break;
    pfVar2 = pfVar3 + 1;
  } while ((fVar1 != 1.234321e+38) || (NAN(fVar1)));
  return pfVar3 < a + count;
}

Assistant:

static bool Internal_IsUnsetFloat(
  size_t count,
  const float* a
)
{
  const float * e = a + count;
  while (a < e)
  {
    float x = *a++;
    if (ON_UNSET_FLOAT == x || ON_UNSET_POSITIVE_FLOAT == x)
      return true;
  }
  return false;
}